

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstraintsGroup.cpp
# Opt level: O0

vector<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_> *
__thiscall iDynTree::optimalcontrol::ConstraintsGroup::getTimeRanges(ConstraintsGroup *this)

{
  bool bVar1;
  uint uVar2;
  size_type __new_size;
  element_type *this_00;
  reference pvVar3;
  long *in_RDI;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>
  *constraint;
  iterator __end2;
  iterator __begin2;
  GroupOfConstraintsMap *__range2;
  size_t i;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>
  *in_stack_ffffffffffffffa8;
  vector<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_>
  *in_stack_ffffffffffffffd0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_true>
  local_28;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_true>
  local_20;
  long local_18;
  size_type local_10;
  
  __new_size = std::
               vector<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_>
               ::size((vector<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_>
                       *)(*in_RDI + 0x280));
  uVar2 = numberOfConstraints((ConstraintsGroup *)0x396bb1);
  if (__new_size != uVar2) {
    numberOfConstraints((ConstraintsGroup *)0x396bd7);
    std::
    vector<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_>
    ::resize(in_stack_ffffffffffffffd0,__new_size);
  }
  local_10 = 0;
  local_18 = *in_RDI;
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>
       ::begin(in_stack_ffffffffffffffa8);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>
       ::end(in_stack_ffffffffffffffa8);
  while( true ) {
    bVar1 = std::__detail::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_false,_true>
    ::operator*((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_false,_true>
                 *)0x396c38);
    this_00 = std::
              __shared_ptr_access<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x396c4b);
    pvVar3 = std::
             vector<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_>
             ::operator[]((vector<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_>
                           *)(*in_RDI + 0x280),local_10);
    pvVar3->m_initTime = (this_00->timeRange).m_initTime;
    pvVar3->m_endTime = (this_00->timeRange).m_endTime;
    pvVar3->m_anyTime = (this_00->timeRange).m_anyTime;
    local_10 = local_10 + 1;
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_false,_true>
    ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_false,_true>
                  *)this_00);
  }
  return (vector<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_>
          *)(*in_RDI + 0x280);
}

Assistant:

std::vector<TimeRange>& ConstraintsGroup::getTimeRanges()
        {
            if (m_pimpl->timeRanges.size() != numberOfConstraints()) {
                m_pimpl->timeRanges.resize(numberOfConstraints());
            }

            size_t i=0;
            for (auto& constraint : m_pimpl->group) {
                m_pimpl->timeRanges[i] = constraint.second->timeRange;
                ++i;
            }
            return m_pimpl->timeRanges;
        }